

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<bool>_>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *this,Animatable<bool> *fallback)

{
  Animatable<bool> *fallback_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<bool>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<bool>_>::optional(&this->_attrib);
  this->_empty = false;
  Animatable<bool>::Animatable(&this->_fallback,fallback);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}